

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

_Bool pmsav8_mpu_lookup_arm
                (CPUARMState *env,uint32_t address,MMUAccessType access_type,ARMMMUIdx mmu_idx,
                hwaddr *phys_ptr,MemTxAttrs *txattrs,int *prot,_Bool *is_subpage,
                ARMMMUFaultInfo_conflict *fi,uint32_t *mregion)

{
  uc_struct_conflict1 *puVar1;
  long lVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  bool bVar5;
  _Bool _Var6;
  _Bool _Var7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  char *file;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  
  puVar1 = env->uc;
  uVar9 = mmu_idx - ARMMMUIdx_E10_0;
  uVar12 = (ulong)uVar9;
  if (uVar9 < 0x37) {
    _Var7 = true;
    if ((0x55000000010082U >> (uVar12 & 0x3f) & 1) != 0) goto LAB_00583205;
    if ((0xdUL >> (uVar12 & 0x3f) & 1) == 0) goto LAB_00583553;
LAB_00583601:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
    ;
    iVar13 = 0x2386;
LAB_005835fa:
    g_assertion_message_expr(file,iVar13,(char *)0x0);
  }
LAB_00583553:
  _Var7 = false;
LAB_00583205:
  if ((0x37 < uVar9) || ((0xff000000070fffU >> (uVar12 & 0x3f) & 1) == 0)) {
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
    ;
    iVar13 = 0x37c;
    goto LAB_005835fa;
  }
  lVar2 = *(long *)(&DAT_00d68330 + uVar12 * 8);
  uVar10 = puVar1->init_target_page->mask;
  *is_subpage = false;
  *phys_ptr = (ulong)address;
  *prot = 0;
  if (mregion != (uint32_t *)0x0) {
    *mregion = 0xffffffff;
  }
  _Var6 = regime_translation_disabled(env,mmu_idx);
  if ((!_Var6) && (((address & 0xfff00000) != 0xe0000000 || ((env->features & 0x200) == 0)))) {
    _Var7 = pmsav7_use_background_region
                      ((ARMCPU *)(env[-10].cp15.c14_pmevcntr + 0x1b),mmu_idx,_Var7);
    uVar18 = (ulong)*(int *)((long)env[1].xregs + 0x1c);
    if ((long)uVar18 < 1) {
      if (!_Var7) {
LAB_00583532:
        fi->type = ARMFault_Background;
        return true;
      }
    }
    else {
      uVar11 = uVar10 & address;
      puVar3 = (env->pmsav8).rbar[lVar2];
      puVar4 = (env->pmsav8).rlar[lVar2];
      uVar16 = 0xffffffff;
      do {
        while (uVar17 = puVar4[uVar18 - 1], (uVar17 & 1) == 0) {
LAB_0058342c:
          bVar5 = uVar18 < 2;
          uVar18 = uVar18 - 1;
          if (bVar5) {
            if (_Var7 != false) goto LAB_005834b5;
            goto LAB_00583532;
          }
        }
        uVar19 = puVar3[uVar18 - 1] & 0xffffffe0;
        uVar17 = uVar17 | 0x1f;
        if ((address < uVar19) || (uVar17 < address)) {
          if (((uVar19 <= uVar17) &&
              ((ulong)uVar11 <= ((ulong)((uVar17 - uVar19) + 1) + (ulong)uVar19) - 1)) &&
             ((ulong)uVar19 <= ((ulong)uVar11 - 1) - (long)puVar1->init_target_page->mask)) {
            *is_subpage = true;
          }
          goto LAB_0058342c;
        }
        if ((uVar11 < uVar19) || (uVar17 < ~uVar10 + uVar11)) {
          *is_subpage = true;
        }
        if (uVar16 != 0xffffffff) {
          fi->type = ARMFault_Permission;
          *(undefined4 *)((long)&fi->s2addr + 4) = 1;
          return true;
        }
        iVar13 = (int)uVar18;
        uVar16 = iVar13 - 1;
        _Var7 = true;
        bVar5 = 1 < uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar5);
      uVar16 = iVar13 - 1;
LAB_005834b5:
      if (uVar16 != 0xffffffff) {
        uVar10 = (env->pmsav8).rbar[lVar2][uVar16];
        uVar11 = uVar10 >> 1 & 3;
        if (uVar9 < 0x37) {
          if ((0x55000000010082U >> (uVar12 & 0x3f) & 1) == 0) {
            if ((0xdUL >> (uVar12 & 0x3f) & 1) != 0) goto LAB_00583601;
            goto LAB_0058356a;
          }
          bVar15 = 1;
          bVar14 = 1;
          uVar9 = 3;
          switch(uVar11) {
          case 0:
            goto switchD_0058351b_caseD_0;
          case 2:
            goto switchD_0058351b_caseD_2;
          case 3:
            goto switchD_0058351b_caseD_3;
          }
        }
        else {
LAB_0058356a:
          bVar15 = 0;
          bVar14 = 0;
          uVar9 = 3;
          switch(uVar11) {
          case 0:
switchD_0058351b_caseD_0:
            uVar9 = (uint)(bVar14 ^ 1) + (uint)(bVar14 ^ 1) * 2;
            break;
          case 2:
switchD_0058351b_caseD_2:
            uVar9 = (uint)(bVar15 ^ 1);
            break;
          case 3:
switchD_0058351b_caseD_3:
            uVar9 = 1;
          }
        }
        uVar11 = uVar9 + 4;
        if ((uVar10 & 1) != 0) {
          uVar11 = uVar9;
        }
        if ((0xdfffffff < address & (*(byte *)((long)&env->features + 1) & 2) >> 1) != 0) {
          uVar11 = uVar9;
        }
        if (uVar9 == 0) {
          uVar11 = uVar9;
        }
        *prot = uVar11;
        if (mregion != (uint32_t *)0x0) {
          *mregion = uVar16;
        }
        goto LAB_00583488;
      }
    }
  }
  if ((env->features & 0x200) == 0) {
    *prot = 3;
    if (address < 0xf0000000) {
      uVar9 = 7;
      if ((int)address < 0) goto LAB_00583488;
    }
    else {
      uVar8 = regime_el(env,mmu_idx);
      if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)uVar8 * 8 + -0x27) & 0x20) == 0)
      goto LAB_00583488;
      uVar9 = *prot | 4;
    }
  }
  else {
    uVar9 = 7;
    if (((((0x3fffffff < address + 0xa0000000) && (0x1fffffff < address)) &&
         ((uVar10 = address & 0xe0000000, uVar10 != 0x20000000 &&
          ((uVar9 = 3, address < 0xe0000000 && (uVar10 != 0xc0000000)))))) &&
        ((int)address < 0x40000000)) && (uVar10 != 0xa0000000)) goto LAB_00583488;
  }
  *prot = uVar9;
LAB_00583488:
  fi->type = ARMFault_Permission;
  *(undefined4 *)((long)&fi->s2addr + 4) = 1;
  return ((uint)*prot >> (access_type & 0x1f) & 1) == 0;
}

Assistant:

bool pmsav8_mpu_lookup(CPUARMState *env, uint32_t address,
                              MMUAccessType access_type, ARMMMUIdx mmu_idx,
                              hwaddr *phys_ptr, MemTxAttrs *txattrs,
                              int *prot, bool *is_subpage,
                              ARMMMUFaultInfo *fi, uint32_t *mregion)
{
    struct uc_struct *uc = env->uc;
    /* Perform a PMSAv8 MPU lookup (without also doing the SAU check
     * that a full phys-to-virt translation does).
     * mregion is (if not NULL) set to the region number which matched,
     * or -1 if no region number is returned (MPU off, address did not
     * hit a region, address hit in multiple regions).
     * We set is_subpage to true if the region hit doesn't cover the
     * entire TARGET_PAGE the address is within.
     */
    ARMCPU *cpu = env_archcpu(env);
    bool is_user = regime_is_user(env, mmu_idx);
    uint32_t secure = regime_is_secure(env, mmu_idx);
    int n;
    int matchregion = -1;
    bool hit = false;
    uint32_t addr_page_base = address & TARGET_PAGE_MASK;
    uint32_t addr_page_limit = addr_page_base + (TARGET_PAGE_SIZE - 1);

    *is_subpage = false;
    *phys_ptr = address;
    *prot = 0;
    if (mregion) {
        *mregion = -1;
    }

    /* Unlike the ARM ARM pseudocode, we don't need to check whether this
     * was an exception vector read from the vector table (which is always
     * done using the default system address map), because those accesses
     * are done in arm_v7m_load_vector(), which always does a direct
     * read using address_space_ldl(), rather than going via this function.
     */
    if (regime_translation_disabled(env, mmu_idx)) { /* MPU disabled */
        hit = true;
    } else if (m_is_ppb_region(env, address)) {
        hit = true;
    } else {
        if (pmsav7_use_background_region(cpu, mmu_idx, is_user)) {
            hit = true;
        }

        for (n = (int)cpu->pmsav7_dregion - 1; n >= 0; n--) {
            /* region search */
            /* Note that the base address is bits [31:5] from the register
             * with bits [4:0] all zeroes, but the limit address is bits
             * [31:5] from the register with bits [4:0] all ones.
             */
            uint32_t base = env->pmsav8.rbar[secure][n] & ~0x1f;
            uint32_t limit = env->pmsav8.rlar[secure][n] | 0x1f;

            if (!(env->pmsav8.rlar[secure][n] & 0x1)) {
                /* Region disabled */
                continue;
            }

            if (address < base || address > limit) {
                /*
                 * Address not in this region. We must check whether the
                 * region covers addresses in the same page as our address.
                 * In that case we must not report a size that covers the
                 * whole page for a subsequent hit against a different MPU
                 * region or the background region, because it would result in
                 * incorrect TLB hits for subsequent accesses to addresses that
                 * are in this MPU region.
                 */
                if (limit >= base &&
                    ranges_overlap(base, limit - base + 1,
                                   addr_page_base,
                                   TARGET_PAGE_SIZE)) {
                    *is_subpage = true;
                }
                continue;
            }

            if (base > addr_page_base || limit < addr_page_limit) {
                *is_subpage = true;
            }

            if (matchregion != -1) {
                /* Multiple regions match -- always a failure (unlike
                 * PMSAv7 where highest-numbered-region wins)
                 */
                fi->type = ARMFault_Permission;
                fi->level = 1;
                return true;
            }

            matchregion = n;
            hit = true;
        }
    }

    if (!hit) {
        /* background fault */
        fi->type = ARMFault_Background;
        return true;
    }

    if (matchregion == -1) {
        /* hit using the background region */
        get_phys_addr_pmsav7_default(env, mmu_idx, address, prot);
    } else {
        uint32_t ap = extract32(env->pmsav8.rbar[secure][matchregion], 1, 2);
        uint32_t xn = extract32(env->pmsav8.rbar[secure][matchregion], 0, 1);

        if (m_is_system_region(env, address)) {
            /* System space is always execute never */
            xn = 1;
        }

        *prot = simple_ap_to_rw_prot(env, mmu_idx, ap);
        if (*prot && !xn) {
            *prot |= PAGE_EXEC;
        }
        /* We don't need to look the attribute up in the MAIR0/MAIR1
         * registers because that only tells us about cacheability.
         */
        if (mregion) {
            *mregion = matchregion;
        }
    }

    fi->type = ARMFault_Permission;
    fi->level = 1;
    return !(*prot & (1 << access_type));
}